

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

int mbedtls_rsa_rsassa_pss_verify_ext
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              int mode,mbedtls_md_type_t md_alg,uint hashlen,uchar *hash,
              mbedtls_md_type_t mgf1_hash_id,int expected_salt_len,uchar *sig)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  mbedtls_md_info_t *pmVar5;
  size_t sVar6;
  uchar *puVar7;
  uchar *src;
  bool bVar8;
  undefined4 local_4dc;
  byte local_4d8;
  uchar local_4d7 [7];
  uchar buf [1024];
  mbedtls_md_context_t md_ctx;
  mbedtls_md_info_t *md_info;
  size_t msb;
  size_t observed_salt_len;
  uchar local_a0 [4];
  uint hlen;
  uchar zeros [8];
  uchar result [64];
  uchar *hash_start;
  uchar *p;
  size_t siglen;
  int ret;
  uint hashlen_local;
  mbedtls_md_type_t md_alg_local;
  int mode_local;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  mbedtls_rsa_context *ctx_local;
  
  if ((mode == 1) && (ctx->padding != 1)) {
    ctx_local._4_4_ = -0x4080;
  }
  else {
    p = (uchar *)ctx->len;
    if ((p < (uchar *)0x10) || ((uchar *)0x400 < p)) {
      ctx_local._4_4_ = -0x4080;
    }
    else {
      if (mode == 0) {
        local_4dc = mbedtls_rsa_public(ctx,sig,&local_4d8);
      }
      else {
        local_4dc = mbedtls_rsa_private(ctx,f_rng,p_rng,sig,&local_4d8);
      }
      if (local_4dc == 0) {
        hash_start = &local_4d8;
        if ((p + -0x4d9)[(long)&stack0x00000000] == 0xbc) {
          siglen._4_4_ = hashlen;
          if (md_alg != MBEDTLS_MD_NONE) {
            pmVar5 = mbedtls_md_info_from_type(md_alg);
            if (pmVar5 == (mbedtls_md_info_t *)0x0) {
              return -0x4080;
            }
            bVar2 = mbedtls_md_get_size(pmVar5);
            siglen._4_4_ = (uint)bVar2;
          }
          pmVar5 = mbedtls_md_info_from_type(mgf1_hash_id);
          if (pmVar5 == (mbedtls_md_info_t *)0x0) {
            ctx_local._4_4_ = -0x4080;
          }
          else {
            bVar2 = mbedtls_md_get_size(pmVar5);
            uVar3 = (uint)bVar2;
            memset(local_a0,0,8);
            sVar6 = mbedtls_mpi_bitlen(&ctx->N);
            cVar1 = (char)(sVar6 - 1);
            if ((int)(uint)local_4d8 >> (('\b' - (char)((long)p << 3)) + cVar1 & 0x1fU) == 0) {
              if ((sVar6 - 1 & 7) == 0) {
                hash_start = local_4d7;
                p = p + -1;
              }
              if (p < (uchar *)(ulong)(uVar3 + 2)) {
                ctx_local._4_4_ = -0x4080;
              }
              else {
                puVar7 = hash_start + (long)p;
                src = puVar7 + (-1 - (ulong)uVar3);
                mbedtls_md_init((mbedtls_md_context_t *)(buf + 0x3f8));
                siglen._0_4_ = mbedtls_md_setup((mbedtls_md_context_t *)(buf + 0x3f8),pmVar5,0);
                if (((int)siglen == 0) &&
                   (siglen._0_4_ = mgf_mask(hash_start,(size_t)(p + (-1 - (ulong)uVar3)),src,
                                            (ulong)uVar3,(mbedtls_md_context_t *)(buf + 0x3f8)),
                   (int)siglen == 0)) {
                  local_4d8 = local_4d8 & (byte)(0xff >> ((char)((long)p << 3) - cVar1 & 0x1fU));
                  while( true ) {
                    bVar8 = false;
                    if (hash_start < puVar7 + (-2 - (ulong)uVar3)) {
                      bVar8 = *hash_start == '\0';
                    }
                    if (!bVar8) break;
                    hash_start = hash_start + 1;
                  }
                  if (*hash_start == '\x01') {
                    sVar6 = (long)src - (long)(hash_start + 1);
                    if ((expected_salt_len == -1) || (sVar6 == (long)expected_salt_len)) {
                      siglen._0_4_ = mbedtls_md_starts((mbedtls_md_context_t *)(buf + 0x3f8));
                      if ((((int)siglen == 0) &&
                          (((siglen._0_4_ = mbedtls_md_update((mbedtls_md_context_t *)(buf + 0x3f8),
                                                              local_a0,8), (int)siglen == 0 &&
                            (siglen._0_4_ = mbedtls_md_update((mbedtls_md_context_t *)(buf + 0x3f8),
                                                              hash,(ulong)siglen._4_4_),
                            (int)siglen == 0)) &&
                           (siglen._0_4_ = mbedtls_md_update((mbedtls_md_context_t *)(buf + 0x3f8),
                                                             hash_start + 1,sVar6), (int)siglen == 0
                           )))) && ((siglen._0_4_ = mbedtls_md_finish((mbedtls_md_context_t *)
                                                                      (buf + 0x3f8),zeros),
                                    (int)siglen == 0 &&
                                    (iVar4 = memcmp(src,zeros,(ulong)uVar3), iVar4 != 0)))) {
                        siglen._0_4_ = -0x4380;
                      }
                    }
                    else {
                      siglen._0_4_ = -0x4100;
                    }
                  }
                  else {
                    siglen._0_4_ = -0x4100;
                  }
                }
                mbedtls_md_free((mbedtls_md_context_t *)(buf + 0x3f8));
                ctx_local._4_4_ = (int)siglen;
              }
            }
            else {
              ctx_local._4_4_ = -0x4080;
            }
          }
        }
        else {
          ctx_local._4_4_ = -0x4100;
        }
      }
      else {
        ctx_local._4_4_ = local_4dc;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_rsa_rsassa_pss_verify_ext( mbedtls_rsa_context *ctx,
                               int (*f_rng)(void *, unsigned char *, size_t),
                               void *p_rng,
                               int mode,
                               mbedtls_md_type_t md_alg,
                               unsigned int hashlen,
                               const unsigned char *hash,
                               mbedtls_md_type_t mgf1_hash_id,
                               int expected_salt_len,
                               const unsigned char *sig )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t siglen;
    unsigned char *p;
    unsigned char *hash_start;
    unsigned char result[MBEDTLS_MD_MAX_SIZE];
    unsigned char zeros[8];
    unsigned int hlen;
    size_t observed_salt_len, msb;
    const mbedtls_md_info_t *md_info;
    mbedtls_md_context_t md_ctx;
    unsigned char buf[MBEDTLS_MPI_MAX_SIZE];

    RSA_VALIDATE_RET( ctx != NULL );
    RSA_VALIDATE_RET( mode == MBEDTLS_RSA_PRIVATE ||
                      mode == MBEDTLS_RSA_PUBLIC );
    RSA_VALIDATE_RET( sig != NULL );
    RSA_VALIDATE_RET( ( md_alg  == MBEDTLS_MD_NONE &&
                        hashlen == 0 ) ||
                      hash != NULL );

    if( mode == MBEDTLS_RSA_PRIVATE && ctx->padding != MBEDTLS_RSA_PKCS_V21 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    siglen = ctx->len;

    if( siglen < 16 || siglen > sizeof( buf ) )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    ret = ( mode == MBEDTLS_RSA_PUBLIC )
          ? mbedtls_rsa_public(  ctx, sig, buf )
          : mbedtls_rsa_private( ctx, f_rng, p_rng, sig, buf );

    if( ret != 0 )
        return( ret );

    p = buf;

    if( buf[siglen - 1] != 0xBC )
        return( MBEDTLS_ERR_RSA_INVALID_PADDING );

    if( md_alg != MBEDTLS_MD_NONE )
    {
        /* Gather length of hash to sign */
        md_info = mbedtls_md_info_from_type( md_alg );
        if( md_info == NULL )
            return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

        hashlen = mbedtls_md_get_size( md_info );
    }

    md_info = mbedtls_md_info_from_type( mgf1_hash_id );
    if( md_info == NULL )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    hlen = mbedtls_md_get_size( md_info );

    memset( zeros, 0, 8 );

    /*
     * Note: EMSA-PSS verification is over the length of N - 1 bits
     */
    msb = mbedtls_mpi_bitlen( &ctx->N ) - 1;

    if( buf[0] >> ( 8 - siglen * 8 + msb ) )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    /* Compensate for boundary condition when applying mask */
    if( msb % 8 == 0 )
    {
        p++;
        siglen -= 1;
    }

    if( siglen < hlen + 2 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );
    hash_start = p + siglen - hlen - 1;

    mbedtls_md_init( &md_ctx );
    if( ( ret = mbedtls_md_setup( &md_ctx, md_info, 0 ) ) != 0 )
        goto exit;

    ret = mgf_mask( p, siglen - hlen - 1, hash_start, hlen, &md_ctx );
    if( ret != 0 )
        goto exit;

    buf[0] &= 0xFF >> ( siglen * 8 - msb );

    while( p < hash_start - 1 && *p == 0 )
        p++;

    if( *p++ != 0x01 )
    {
        ret = MBEDTLS_ERR_RSA_INVALID_PADDING;
        goto exit;
    }

    observed_salt_len = hash_start - p;

    if( expected_salt_len != MBEDTLS_RSA_SALT_LEN_ANY &&
        observed_salt_len != (size_t) expected_salt_len )
    {
        ret = MBEDTLS_ERR_RSA_INVALID_PADDING;
        goto exit;
    }

    /*
     * Generate H = Hash( M' )
     */
    ret = mbedtls_md_starts( &md_ctx );
    if ( ret != 0 )
        goto exit;
    ret = mbedtls_md_update( &md_ctx, zeros, 8 );
    if ( ret != 0 )
        goto exit;
    ret = mbedtls_md_update( &md_ctx, hash, hashlen );
    if ( ret != 0 )
        goto exit;
    ret = mbedtls_md_update( &md_ctx, p, observed_salt_len );
    if ( ret != 0 )
        goto exit;
    ret = mbedtls_md_finish( &md_ctx, result );
    if ( ret != 0 )
        goto exit;

    if( memcmp( hash_start, result, hlen ) != 0 )
    {
        ret = MBEDTLS_ERR_RSA_VERIFY_FAILED;
        goto exit;
    }

exit:
    mbedtls_md_free( &md_ctx );

    return( ret );
}